

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

void opj_setup_encoder(opj_cinfo_t *cinfo,opj_cparameters_t *parameters,opj_image_t *image)

{
  if (image != (opj_image_t *)0x0 &&
      (parameters != (opj_cparameters_t *)0x0 && cinfo != (opj_cinfo_t *)0x0)) {
    if (cinfo->codec_format == CODEC_JP2) {
      jp2_setup_encoder((opj_jp2_t *)cinfo->jp2_handle,parameters,image);
      return;
    }
    if (cinfo->codec_format == CODEC_J2K) {
      j2k_setup_encoder((opj_j2k_t *)cinfo->j2k_handle,parameters,image);
      return;
    }
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_setup_encoder(opj_cinfo_t *cinfo, opj_cparameters_t *parameters, opj_image_t *image) {
	if(cinfo && parameters && image) {
		switch(cinfo->codec_format) {
			case CODEC_J2K:
				j2k_setup_encoder((opj_j2k_t*)cinfo->j2k_handle, parameters, image);
				break;
			case CODEC_JP2:
				jp2_setup_encoder((opj_jp2_t*)cinfo->jp2_handle, parameters, image);
				break;
			case CODEC_JPT:
			case CODEC_UNKNOWN:
			default:
				break;
		}
	}
}